

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.h
# Opt level: O0

void __thiscall
wasm::EffectAnalyzer::InternalAnalyzer::visitArrayCopy(InternalAnalyzer *this,ArrayCopy *curr)

{
  bool bVar1;
  ArrayCopy *curr_local;
  InternalAnalyzer *this_local;
  
  bVar1 = Type::isNull((Type *)(*(long *)(curr + 0x10) + 8));
  if ((!bVar1) && (bVar1 = Type::isNull((Type *)(*(long *)(curr + 0x20) + 8)), !bVar1)) {
    this->parent->readsArray = true;
    this->parent->writesArray = true;
    this->parent->implicitTrap = true;
    return;
  }
  this->parent->trap = true;
  return;
}

Assistant:

void visitArrayCopy(ArrayCopy* curr) {
      if (curr->destRef->type.isNull() || curr->srcRef->type.isNull()) {
        parent.trap = true;
        return;
      }
      parent.readsArray = true;
      parent.writesArray = true;
      // traps when a ref is null, or when out of bounds.
      parent.implicitTrap = true;
    }